

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O3

void __thiscall nigel::IMC_Generator::printAssembly(IMC_Generator *this,CodeBase *base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  undefined8 *puVar9;
  long *plVar10;
  uint uVar11;
  size_type *psVar12;
  _List_node_base *p_Var13;
  IMC_Generator *pIVar14;
  IMC_Generator *pIVar15;
  _func_int **pp_Var16;
  undefined8 uVar17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Da_27;
  undefined4 extraout_XMM0_Da_28;
  undefined4 extraout_XMM0_Da_29;
  undefined4 extraout_XMM0_Da_30;
  undefined4 extraout_XMM0_Da_31;
  undefined4 extraout_XMM0_Da_32;
  undefined4 extraout_XMM0_Da_33;
  undefined4 extraout_XMM0_Da_34;
  undefined4 extraout_XMM0_Da_35;
  undefined4 extraout_XMM0_Da_36;
  undefined4 extraout_XMM0_Da_37;
  undefined4 extraout_XMM0_Da_38;
  undefined4 extraout_XMM0_Da_39;
  undefined4 extraout_XMM0_Da_40;
  undefined4 extraout_XMM0_Da_41;
  undefined4 extraout_XMM0_Da_42;
  undefined4 extraout_XMM0_Da_43;
  undefined4 extraout_XMM0_Da_44;
  undefined4 extraout_XMM0_Da_45;
  undefined4 extraout_XMM0_Da_46;
  undefined4 extraout_XMM0_Da_47;
  undefined4 extraout_XMM0_Da_48;
  undefined4 extraout_XMM0_Da_49;
  undefined4 extraout_XMM0_Da_50;
  undefined4 extraout_XMM0_Da_51;
  undefined4 extraout_XMM0_Da_52;
  undefined4 extraout_XMM0_Da_53;
  undefined4 extraout_XMM0_Da_54;
  undefined4 extraout_XMM0_Da_55;
  undefined4 extraout_XMM0_Da_56;
  undefined4 extraout_XMM0_Da_57;
  undefined4 extraout_XMM0_Da_58;
  undefined4 extraout_XMM0_Da_59;
  undefined4 extraout_XMM0_Da_60;
  undefined4 extraout_XMM0_Da_61;
  undefined4 extraout_XMM0_Da_62;
  undefined4 extraout_XMM0_Da_63;
  undefined4 extraout_XMM0_Da_64;
  undefined4 extraout_XMM0_Da_65;
  undefined4 extraout_XMM0_Da_66;
  undefined4 extraout_XMM0_Da_67;
  undefined4 extraout_XMM0_Da_68;
  undefined4 extraout_XMM0_Da_69;
  undefined4 extraout_XMM0_Da_70;
  undefined4 extraout_XMM0_Da_71;
  undefined4 extraout_XMM0_Da_72;
  undefined4 extraout_XMM0_Da_73;
  undefined4 extraout_XMM0_Da_74;
  undefined4 extraout_XMM0_Da_75;
  undefined4 extraout_XMM0_Da_76;
  undefined4 extraout_XMM0_Da_77;
  undefined4 extraout_XMM0_Da_78;
  undefined4 extraout_XMM0_Da_79;
  undefined4 extraout_XMM0_Da_80;
  undefined4 extraout_XMM0_Da_81;
  undefined4 extraout_XMM0_Da_82;
  undefined4 extraout_XMM0_Da_83;
  undefined4 extraout_XMM0_Da_84;
  undefined4 extraout_XMM0_Da_85;
  undefined4 extraout_XMM0_Da_86;
  undefined4 extraout_XMM0_Da_87;
  undefined4 extraout_XMM0_Da_88;
  undefined4 extraout_XMM0_Da_89;
  undefined4 extraout_XMM0_Da_90;
  undefined4 extraout_XMM0_Da_91;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double __x;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Db_32;
  undefined4 extraout_XMM0_Db_33;
  undefined4 extraout_XMM0_Db_34;
  undefined4 extraout_XMM0_Db_35;
  undefined4 extraout_XMM0_Db_36;
  undefined4 extraout_XMM0_Db_37;
  undefined4 extraout_XMM0_Db_38;
  undefined4 extraout_XMM0_Db_39;
  undefined4 extraout_XMM0_Db_40;
  undefined4 extraout_XMM0_Db_41;
  undefined4 extraout_XMM0_Db_42;
  undefined4 extraout_XMM0_Db_43;
  undefined4 extraout_XMM0_Db_44;
  undefined4 extraout_XMM0_Db_45;
  undefined4 extraout_XMM0_Db_46;
  undefined4 extraout_XMM0_Db_47;
  undefined4 extraout_XMM0_Db_48;
  undefined4 extraout_XMM0_Db_49;
  undefined4 extraout_XMM0_Db_50;
  undefined4 extraout_XMM0_Db_51;
  undefined4 extraout_XMM0_Db_52;
  undefined4 extraout_XMM0_Db_53;
  undefined4 extraout_XMM0_Db_54;
  undefined4 extraout_XMM0_Db_55;
  undefined4 extraout_XMM0_Db_56;
  undefined4 extraout_XMM0_Db_57;
  undefined4 extraout_XMM0_Db_58;
  undefined4 extraout_XMM0_Db_59;
  undefined4 extraout_XMM0_Db_60;
  undefined4 extraout_XMM0_Db_61;
  undefined4 extraout_XMM0_Db_62;
  undefined4 extraout_XMM0_Db_63;
  undefined4 extraout_XMM0_Db_64;
  undefined4 extraout_XMM0_Db_65;
  undefined4 extraout_XMM0_Db_66;
  undefined4 extraout_XMM0_Db_67;
  undefined4 extraout_XMM0_Db_68;
  undefined4 extraout_XMM0_Db_69;
  undefined4 extraout_XMM0_Db_70;
  undefined4 extraout_XMM0_Db_71;
  undefined4 extraout_XMM0_Db_72;
  undefined4 extraout_XMM0_Db_73;
  undefined4 extraout_XMM0_Db_74;
  undefined4 extraout_XMM0_Db_75;
  undefined4 extraout_XMM0_Db_76;
  undefined4 extraout_XMM0_Db_77;
  undefined4 extraout_XMM0_Db_78;
  undefined4 extraout_XMM0_Db_79;
  undefined4 extraout_XMM0_Db_80;
  undefined4 extraout_XMM0_Db_81;
  undefined4 extraout_XMM0_Db_82;
  undefined4 extraout_XMM0_Db_83;
  undefined4 extraout_XMM0_Db_84;
  undefined4 extraout_XMM0_Db_85;
  undefined4 extraout_XMM0_Db_86;
  undefined4 extraout_XMM0_Db_87;
  undefined4 extraout_XMM0_Db_88;
  undefined4 extraout_XMM0_Db_89;
  undefined4 extraout_XMM0_Db_90;
  undefined4 extraout_XMM0_Db_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  String out;
  String tabs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [32];
  String local_368;
  _Elt_pointer *local_348 [2];
  _Elt_pointer local_338 [2];
  String local_328;
  IMC_Generator *local_308;
  long local_300;
  undefined1 local_2f8 [48];
  shared_ptr<nigel::IM_Operator> local_2c8;
  shared_ptr<nigel::IM_Operator> local_2b8;
  shared_ptr<nigel::IM_Operator> local_2a8;
  shared_ptr<nigel::IM_Operator> local_298;
  shared_ptr<nigel::IM_Operator> local_288;
  shared_ptr<nigel::IM_Operator> local_278;
  shared_ptr<nigel::IM_Operator> local_268;
  shared_ptr<nigel::IM_Operator> local_258;
  shared_ptr<nigel::IM_Operator> local_248;
  shared_ptr<nigel::IM_Operator> local_238;
  undefined1 local_228 [16];
  shared_ptr<nigel::IM_Operator> local_218;
  shared_ptr<nigel::IM_Operator> local_208;
  shared_ptr<nigel::IM_Operator> local_1f8;
  shared_ptr<nigel::IM_Operator> local_1e8;
  shared_ptr<nigel::IM_Operator> local_1d8;
  shared_ptr<nigel::IM_Operator> local_1c8;
  shared_ptr<nigel::IM_Operator> local_1b8;
  shared_ptr<nigel::IM_Operator> local_1a8;
  shared_ptr<nigel::IM_Operator> local_198;
  shared_ptr<nigel::IM_Operator> local_188;
  shared_ptr<nigel::IM_Operator> local_178;
  shared_ptr<nigel::IM_Operator> local_168;
  shared_ptr<nigel::IM_Operator> local_158;
  shared_ptr<nigel::IM_Operator> local_148;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_Operator> local_128;
  shared_ptr<nigel::IM_Operator> local_118;
  shared_ptr<nigel::IM_Operator> local_108;
  shared_ptr<nigel::IM_Operator> local_f8;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  shared_ptr<nigel::IM_Operator> local_a8;
  shared_ptr<nigel::IM_Operator> local_98;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  _List_node_base *local_58;
  String local_50;
  
  local_308 = (IMC_Generator *)local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"__ASM__","");
  helper::log((helper *)&local_308,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (local_308 != (IMC_Generator *)local_2f8) {
    operator_delete(local_308,local_2f8._0_8_ + 1);
  }
  local_308 = (IMC_Generator *)local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
  p_Var13 = (base->imCommands).
            super__List_base<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  local_58 = (_List_node_base *)&base->imCommands;
  if (p_Var13 != local_58) {
    paVar1 = &local_368.field_2;
    paVar2 = &local_3a8.field_2;
    do {
      p_Var4 = p_Var13[1]._M_next;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var13[1]._M_prev;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_348[0] = local_338;
      pIVar15 = local_308;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_348,local_308,
                 (undefined1 *)
                 ((long)&(local_308->super_BuilderExecutable)._vptr_BuilderExecutable + local_300));
      __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      switch(*(undefined4 *)&p_Var4->_M_next) {
      case 0:
        iVar8 = *(int *)((long)&p_Var4->_M_next + 4);
        pIVar14 = pIVar15;
        if (0xa3 < iVar8) {
          if (0xd5 < iVar8) {
            pIVar14 = (IMC_Generator *)"CLR A";
            switch(iVar8) {
            case 0xe0:
              break;
            case 0xe1:
            case 0xe2:
            case 0xe3:
            case 0xe9:
            case 0xea:
            case 0xeb:
            case 0xec:
            case 0xed:
            case 0xee:
            case 0xef:
            case 0xf1:
            case 0xf2:
            case 0xf3:
              goto switchD_00146b68_caseD_77;
            case 0xe4:
              break;
            case 0xe5:
              local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,(IMC_Generator *)"CLR A",&local_78);
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0x170ca8);
              psVar12 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_3a8.field_2._M_allocated_capacity = *psVar12;
                local_3a8.field_2._8_8_ = puVar9[3];
                local_3a8._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_3a8.field_2._M_allocated_capacity = *psVar12;
                local_3a8._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_3a8._M_string_length = puVar9[1];
              *puVar9 = psVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_29,extraout_XMM0_Da_29);
              }
              this_01._M_pi =
                   local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_30,extraout_XMM0_Da_30);
                this_01._M_pi =
                     local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              goto LAB_0014938c;
            case 0xe6:
              break;
            case 0xe7:
              break;
            case 0xe8:
              break;
            case 0xf0:
              break;
            case 0xf4:
              break;
            case 0xf5:
              local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_(&local_368,(IMC_Generator *)"CLR A",&local_a8);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_388,"MOV ",&local_368);
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_388);
              psVar12 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar12) {
                local_3a8.field_2._M_allocated_capacity = *psVar12;
                local_3a8.field_2._8_8_ = puVar9[3];
                local_3a8._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_3a8.field_2._M_allocated_capacity = *psVar12;
                local_3a8._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_3a8._M_string_length = puVar9[1];
              *puVar9 = psVar12;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_26,extraout_XMM0_Da_26);
              }
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_27,extraout_XMM0_Da_27);
              }
              this_01._M_pi =
                   local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368._M_dataplus._M_p != paVar1) {
                operator_delete(local_368._M_dataplus._M_p,
                                local_368.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_28,extraout_XMM0_Da_28);
                this_01._M_pi =
                     local_a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              goto LAB_0014938c;
            case 0xf6:
              break;
            case 0xf7:
              break;
            case 0xf8:
              break;
            case 0xf9:
              break;
            default:
              pIVar14 = pIVar15;
              if (iVar8 != 0xd6) goto switchD_00146b68_caseD_77;
            }
            goto switchD_00146db9_caseD_e4;
          }
          switch(iVar8) {
          case 0xc0:
            local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_168);
            std::operator+(&local_3a8,"PUSH ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18);
            }
            this_01._M_pi =
                 local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19);
              this_01._M_pi =
                   local_168.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          case 0xc1:
          case 0xc4:
          case 0xc6:
          case 199:
          case 0xca:
          case 0xcb:
          case 0xcc:
          case 0xcd:
          case 0xce:
          case 0xcf:
          case 0xd1:
            goto switchD_00146b68_caseD_77;
          case 0xc2:
            local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_248);
            std::operator+(&local_3a8,"CLR ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22);
            }
            this_01._M_pi =
                 local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23);
              this_01._M_pi =
                   local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          case 0xc3:
            goto switchD_00146db9_caseD_e4;
          case 0xc5:
            local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_188);
            std::operator+(&local_3a8,"XCH A, ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24);
            }
            this_01._M_pi =
                 local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_25,extraout_XMM0_Da_25);
              this_01._M_pi =
                   local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          case 200:
            goto switchD_00146db9_caseD_e4;
          case 0xc9:
            goto switchD_00146db9_caseD_e4;
          case 0xd0:
            local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_178);
            std::operator+(&local_3a8,"POP ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16);
            }
            this_01._M_pi =
                 local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17);
              this_01._M_pi =
                   local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          case 0xd2:
            local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_258);
            std::operator+(&local_3a8,"SETB ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20);
            }
            this_01._M_pi =
                 local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21);
              this_01._M_pi =
                   local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          default:
            switch(iVar8) {
            case 0xa4:
              goto switchD_00146db9_caseD_e4;
            case 0xa5:
            case 0xa7:
              goto switchD_00146b68_caseD_77;
            case 0xa6:
              local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_148);
              std::operator+(&local_3a8,"MOV @R0, ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_35,extraout_XMM0_Da_35);
              }
              this_01._M_pi =
                   local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_36,extraout_XMM0_Da_36);
                this_01._M_pi =
                     local_148.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              break;
            case 0xa8:
              local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_108);
              std::operator+(&local_3a8,"MOV R0, ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_33,extraout_XMM0_Da_33);
              }
              this_01._M_pi =
                   local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_34,extraout_XMM0_Da_34);
                this_01._M_pi =
                     local_108.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              break;
            case 0xa9:
              local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_128);
              std::operator+(&local_3a8,"MOV R1, ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_31,extraout_XMM0_Da_31);
              }
              this_01._M_pi =
                   local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_32,extraout_XMM0_Da_32);
                this_01._M_pi =
                     local_128.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              break;
            default:
              if (iVar8 != 0xb2) goto switchD_00146b68_caseD_77;
              local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_238);
              std::operator+(&local_3a8,"CPL ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_37,extraout_XMM0_Da_37);
              }
              this_01._M_pi =
                   local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_38,extraout_XMM0_Da_38);
                this_01._M_pi =
                     local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
            }
          }
          goto LAB_0014938c;
        }
        if (iVar8 < 0x50) {
          if (iVar8 < 0x23) {
            switch(iVar8) {
            case 0:
              break;
            case 1:
              goto switchD_00146b68_caseD_77;
            case 2:
              local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_268);
              std::operator+(&local_3a8,"LJMP ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
              }
              this_01._M_pi =
                   local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
                this_01._M_pi =
                     local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              goto LAB_0014938c;
            case 3:
              break;
            case 4:
              break;
            default:
              if (iVar8 != 0x14) goto switchD_00146b68_caseD_77;
            }
            goto switchD_00146db9_caseD_e4;
          }
          switch(iVar8) {
          case 0x23:
            goto switchD_00146db9_caseD_e4;
          case 0x24:
            local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_198);
            std::operator+(&local_3a8,"ADD A, ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08);
            }
            this_01._M_pi =
                 local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09);
              this_01._M_pi =
                   local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          case 0x25:
            local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_1a8);
            std::operator+(&local_3a8,"ADD A, ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
            }
            this_01._M_pi =
                 local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
              this_01._M_pi =
                   local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          case 0x26:
            goto switchD_00146db9_caseD_e4;
          case 0x27:
            goto switchD_00146b68_caseD_77;
          case 0x28:
            goto switchD_00146db9_caseD_e4;
          default:
            switch(iVar8) {
            case 0x40:
              local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_288);
              std::operator+(&local_3a8,"JC ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10);
              }
              this_01._M_pi =
                   local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11);
                this_01._M_pi =
                     local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              break;
            default:
              goto switchD_00146b68_caseD_77;
            case 0x44:
              local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_1f8);
              std::operator+(&local_3a8,"ORL A, ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12);
              }
              this_01._M_pi =
                   local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13);
                this_01._M_pi =
                     local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              break;
            case 0x45:
              local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_208);
              std::operator+(&local_3a8,"ORL A, ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14);
              }
              this_01._M_pi =
                   local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15);
                this_01._M_pi =
                     local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              break;
            case 0x46:
              goto switchD_00146db9_caseD_e4;
            }
          }
          goto LAB_0014938c;
        }
        switch(iVar8) {
        case 0x74:
          local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_68);
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0x170ca8);
          psVar12 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8.field_2._8_8_ = puVar9[3];
            local_3a8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_3a8._M_string_length = puVar9[1];
          *puVar9 = psVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_51,extraout_XMM0_Da_51);
          }
          this_01._M_pi =
               local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_52,extraout_XMM0_Da_52);
            this_01._M_pi =
                 local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x75:
          local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_((String *)(local_2f8 + 0x10),pIVar15,&local_88);
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)(local_2f8 + 0x10),0,(char *)0x0,0x170cd0);
          psVar12 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_368.field_2._M_allocated_capacity = *psVar12;
            local_368.field_2._8_8_ = plVar10[3];
            local_368._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_368.field_2._M_allocated_capacity = *psVar12;
            local_368._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_368._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_368);
          pIVar15 = (IMC_Generator *)(puVar9 + 2);
          if ((IMC_Generator *)*puVar9 == pIVar15) {
            local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
            local_388._24_8_ = puVar9[3];
            local_388._0_8_ = (IMC_Generator *)(local_388 + 0x10);
          }
          else {
            local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
            local_388._0_8_ = (IMC_Generator *)*puVar9;
          }
          local_388._8_8_ = puVar9[1];
          *puVar9 = pIVar15;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)((long)(p_Var4 + 1) + 8);
          local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[2]._M_next;
          if (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_(&local_328,(IMC_Generator *)(local_388 + 0x10),&local_98);
          pp_Var16 = (_func_int **)0xf;
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            pp_Var16 = (_func_int **)local_388._16_8_;
          }
          if (pp_Var16 < (_func_int **)(local_328._M_string_length + local_388._8_8_)) {
            uVar17 = (_func_int **)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              uVar17 = local_328.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < (_func_int **)(local_328._M_string_length + local_388._8_8_))
            goto LAB_0014910d;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,local_388._0_8_);
          }
          else {
LAB_0014910d:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_388,(ulong)local_328._M_dataplus._M_p);
          }
          psVar12 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8.field_2._8_8_ = puVar9[3];
            local_3a8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_3a8._M_string_length = puVar9[1];
          *puVar9 = psVar12;
          puVar9[1] = 0;
          *(undefined1 *)psVar12 = 0;
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_74,extraout_XMM0_Da_74);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_75,extraout_XMM0_Da_75);
          }
          if (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_98.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            __x = (double)CONCAT44(extraout_XMM0_Db_76,extraout_XMM0_Da_76);
          }
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_77,extraout_XMM0_Da_77);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar1) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_78,extraout_XMM0_Da_78);
          }
          this_01._M_pi =
               local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((_List_node_base *)local_2f8._16_8_ != (_List_node_base *)(local_2f8 + 0x20)) {
            operator_delete((void *)local_2f8._16_8_,
                            (ulong)((long)&(((shared_ptr<boost::filesystem::path> *)local_2f8._32_8_
                                            )->
                                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + 1));
            __x = (double)CONCAT44(extraout_XMM0_Db_79,extraout_XMM0_Da_79);
            this_01._M_pi =
                 local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x76:
          local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_138);
          std::operator+(&local_3a8,"MOV @R0, ",(String *)local_388);
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_45,extraout_XMM0_Da_45);
          }
          this_01._M_pi =
               local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_46,extraout_XMM0_Da_46);
            this_01._M_pi =
                 local_138.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x77:
        case 0x7a:
        case 0x7b:
        case 0x7c:
        case 0x7d:
        case 0x7e:
        case 0x7f:
        case 0x81:
        case 0x82:
        case 0x83:
        case 0x87:
        case 0x89:
        case 0x8a:
        case 0x8b:
        case 0x8c:
        case 0x8d:
        case 0x8e:
        case 0x8f:
        case 0x91:
        case 0x92:
        case 0x93:
        case 0x97:
switchD_00146b68_caseD_77:
          if (iVar8 < 0x32) {
            if (iVar8 != 0x12) {
              __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
              if (iVar8 != 0x22) goto switchD_00146b34_default;
              goto switchD_00146db9_caseD_e4;
            }
            local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar14,&local_2c8);
            std::operator+(&local_3a8,"LCALL ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_89,extraout_XMM0_Da_89);
            }
            this_01._M_pi =
                 local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_90,extraout_XMM0_Da_90);
              this_01._M_pi =
                   local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
          }
          else {
            if (iVar8 == 0x32) goto switchD_00146db9_caseD_e4;
            __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
            if (iVar8 != 0x70) goto switchD_00146b34_default;
            local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar14,&local_2b8);
            std::operator+(&local_3a8,"JNZ ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_87,extraout_XMM0_Da_87);
            }
            this_01._M_pi =
                 local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_88,extraout_XMM0_Da_88);
              this_01._M_pi =
                   local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
          }
          break;
        case 0x78:
          local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_f8);
          std::operator+(&local_3a8,"MOV R0, ",(String *)local_388);
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_49,extraout_XMM0_Da_49);
          }
          this_01._M_pi =
               local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_50,extraout_XMM0_Da_50);
            this_01._M_pi =
                 local_f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x79:
          local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_118);
          std::operator+(&local_3a8,"MOV R1, ",(String *)local_388);
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_53,extraout_XMM0_Da_53);
          }
          this_01._M_pi =
               local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_54,extraout_XMM0_Da_54);
            this_01._M_pi =
                 local_118.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x80:
          local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_278);
          std::operator+(&local_3a8,"SJMP ",(String *)local_388);
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_47,extraout_XMM0_Da_47);
          }
          this_01._M_pi =
               local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_48,extraout_XMM0_Da_48);
            this_01._M_pi =
                 local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x84:
          goto switchD_00146db9_caseD_e4;
        case 0x85:
          local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_(&local_328,pIVar15,&local_d8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_2f8 + 0x10),"MOV ",&local_328);
          pIVar15 = (IMC_Generator *)0x170ce7;
          plVar10 = (long *)std::__cxx11::string::append((char *)(local_2f8 + 0x10));
          psVar12 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_368.field_2._M_allocated_capacity = *psVar12;
            local_368.field_2._8_8_ = plVar10[3];
            local_368._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_368.field_2._M_allocated_capacity = *psVar12;
            local_368._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_368._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)((long)(p_Var4 + 1) + 8);
          local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[2]._M_next;
          if (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_(&local_50,pIVar15,&local_e8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388,&local_368,&local_50);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_388);
          psVar12 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8.field_2._8_8_ = puVar9[3];
            local_3a8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_3a8._M_string_length = puVar9[1];
          *puVar9 = psVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_67,extraout_XMM0_Da_67);
          }
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_68,extraout_XMM0_Da_68);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_69,extraout_XMM0_Da_69);
          }
          if (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            __x = (double)CONCAT44(extraout_XMM0_Db_70,extraout_XMM0_Da_70);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar1) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_71,extraout_XMM0_Da_71);
          }
          if ((_List_node_base *)local_2f8._16_8_ != (_List_node_base *)(local_2f8 + 0x20)) {
            operator_delete((void *)local_2f8._16_8_,
                            (ulong)((long)&(((shared_ptr<boost::filesystem::path> *)local_2f8._32_8_
                                            )->
                                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr + 1));
            __x = (double)CONCAT44(extraout_XMM0_Db_72,extraout_XMM0_Da_72);
          }
          this_01._M_pi =
               local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_73,extraout_XMM0_Da_73);
            this_01._M_pi =
                 local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x86:
          local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_(&local_368,pIVar15,&local_c8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388,"MOV ",&local_368);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_388);
          psVar12 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8.field_2._8_8_ = puVar9[3];
            local_3a8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_3a8._M_string_length = puVar9[1];
          *puVar9 = psVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_55,extraout_XMM0_Da_55);
          }
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_56,extraout_XMM0_Da_56);
          }
          this_01._M_pi =
               local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar1) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_57,extraout_XMM0_Da_57);
            this_01._M_pi =
                 local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x88:
          local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_(&local_368,pIVar15,&local_b8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388,"MOV ",&local_368);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_388);
          psVar12 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8.field_2._8_8_ = puVar9[3];
            local_3a8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_3a8.field_2._M_allocated_capacity = *psVar12;
            local_3a8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_3a8._M_string_length = puVar9[1];
          *puVar9 = psVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_62,extraout_XMM0_Da_62);
          }
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_63,extraout_XMM0_Da_63);
          }
          this_01._M_pi =
               local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar1) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_64,extraout_XMM0_Da_64);
            this_01._M_pi =
                 local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x90:
          local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_158);
          std::operator+(&local_3a8,"MOV DPTR, ",(String *)local_388);
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_60,extraout_XMM0_Da_60);
          }
          this_01._M_pi =
               local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_61,extraout_XMM0_Da_61);
            this_01._M_pi =
                 local_158.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x94:
          local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_1b8);
          std::operator+(&local_3a8,"SUBB A, ",(String *)local_388);
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_58,extraout_XMM0_Da_58);
          }
          this_01._M_pi =
               local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_59,extraout_XMM0_Da_59);
            this_01._M_pi =
                 local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x95:
          local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)p_Var4->_M_prev;
          local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
          if (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_1c8);
          std::operator+(&local_3a8,"SUBB A, ",(String *)local_388);
          __x = (double)std::__cxx11::string::_M_append
                                  ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_65,extraout_XMM0_Da_65);
          }
          this_01._M_pi =
               local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
            __x = (double)CONCAT44(extraout_XMM0_Db_66,extraout_XMM0_Da_66);
            this_01._M_pi =
                 local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          break;
        case 0x96:
          goto switchD_00146db9_caseD_e4;
        case 0x98:
switchD_00146db9_caseD_e4:
          __x = (double)std::__cxx11::string::append((char *)local_348);
          goto switchD_00146b34_default;
        default:
          switch(iVar8) {
          case 0x50:
            local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_298);
            std::operator+(&local_3a8,"JNC ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_41,extraout_XMM0_Da_41);
            }
            this_01._M_pi =
                 local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_42,extraout_XMM0_Da_42);
              this_01._M_pi =
                   local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          case 0x51:
          case 0x52:
          case 0x53:
            goto switchD_00146b68_caseD_77;
          case 0x54:
            local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_1d8);
            std::operator+(&local_3a8,"ANL A, #",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_43,extraout_XMM0_Da_43);
            }
            this_01._M_pi =
                 local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_44,extraout_XMM0_Da_44);
              this_01._M_pi =
                   local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          case 0x55:
            local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var4->_M_prev;
            local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
            if (local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_1e8);
            std::operator+(&local_3a8,"ANL A, ",(String *)local_388);
            __x = (double)std::__cxx11::string::_M_append
                                    ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1
                             );
              __x = (double)CONCAT44(extraout_XMM0_Db_39,extraout_XMM0_Da_39);
            }
            this_01._M_pi =
                 local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
              __x = (double)CONCAT44(extraout_XMM0_Db_40,extraout_XMM0_Da_40);
              this_01._M_pi =
                   local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
            }
            break;
          case 0x56:
            goto switchD_00146db9_caseD_e4;
          default:
            switch(iVar8) {
            case 0x60:
              local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_2a8);
              std::operator+(&local_3a8,"JZ ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_82,extraout_XMM0_Da_82);
              }
              this_01._M_pi =
                   local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_83,extraout_XMM0_Da_83);
                this_01._M_pi =
                     local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              break;
            default:
              goto switchD_00146b68_caseD_77;
            case 100:
              local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var4->_M_prev;
              local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_next;
              if (local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_((String *)local_388,pIVar15,&local_218);
              std::operator+(&local_3a8,"XRL A, ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_84,extraout_XMM0_Da_84);
              }
              this_01._M_pi =
                   local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_85,extraout_XMM0_Da_85);
                this_01._M_pi =
                     local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
              }
              break;
            case 0x65:
              local_228._0_8_ = p_Var4->_M_prev;
              local_228._8_8_ = p_Var4[1]._M_next;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_)->
                       _M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_)->
                       _M_use_count + 1;
                }
              }
              operatorToString_abi_cxx11_
                        ((String *)local_388,pIVar15,(shared_ptr<nigel::IM_Operator> *)local_228);
              std::operator+(&local_3a8,"XRL A, ",(String *)local_388);
              __x = (double)std::__cxx11::string::_M_append
                                      ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_80,extraout_XMM0_Da_80);
              }
              this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
              if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
                operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
                __x = (double)CONCAT44(extraout_XMM0_Db_81,extraout_XMM0_Da_81);
                this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
              }
              break;
            case 0x66:
              goto switchD_00146db9_caseD_e4;
            }
          }
        }
LAB_0014938c:
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
          __x = (double)CONCAT44(extraout_XMM0_Db_86,extraout_XMM0_Da_86);
        }
        break;
      case 1:
        iVar8 = std::__cxx11::string::compare((char *)(p_Var4 + 3));
        if (iVar8 != 0) {
          local_3a8._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3a8,p_Var4[3]._M_next,
                     (long)&(*(_List_node_base **)((long)(p_Var4 + 3) + 8))->_M_next +
                     (long)p_Var4[3]._M_next);
          std::__cxx11::string::append((char *)&local_3a8);
          std::__cxx11::string::_M_append((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
        }
        uVar3 = *(uint *)((long)(p_Var4 + 2) + 8);
        cVar7 = '\x01';
        if (9 < uVar3) {
          uVar11 = uVar3;
          cVar6 = '\x04';
          do {
            cVar7 = cVar6;
            if (uVar11 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_001471e6;
            }
            if (uVar11 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_001471e6;
            }
            if (uVar11 < 10000) goto LAB_001471e6;
            bVar5 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar6 = cVar7 + '\x04';
          } while (bVar5);
          cVar7 = cVar7 + '\x01';
        }
LAB_001471e6:
        local_368._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_368,cVar7);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_368._M_dataplus._M_p,(uint)local_368._M_string_length,uVar3);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,0x170e67);
        pIVar15 = (IMC_Generator *)(puVar9 + 2);
        if ((IMC_Generator *)*puVar9 == pIVar15) {
          local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
          local_388._24_8_ = puVar9[3];
          local_388._0_8_ = (IMC_Generator *)(local_388 + 0x10);
        }
        else {
          local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
          local_388._0_8_ = (IMC_Generator *)*puVar9;
        }
        local_388._8_8_ = puVar9[1];
        *puVar9 = pIVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append(local_388);
        psVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_3a8.field_2._M_allocated_capacity = *psVar12;
          local_3a8.field_2._8_8_ = puVar9[3];
          local_3a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3a8.field_2._M_allocated_capacity = *psVar12;
          local_3a8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_3a8._M_string_length = puVar9[1];
        *puVar9 = psVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
          operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != paVar1) {
          operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
        }
        __x = (double)std::__cxx11::string::push_back((char)&local_308);
        break;
      case 2:
        uVar3 = *(uint *)((long)(p_Var4 + 2) + 8);
        cVar7 = '\x01';
        if (9 < uVar3) {
          uVar11 = uVar3;
          cVar6 = '\x04';
          do {
            cVar7 = cVar6;
            if (uVar11 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_00146f67;
            }
            if (uVar11 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_00146f67;
            }
            if (uVar11 < 10000) goto LAB_00146f67;
            bVar5 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar6 = cVar7 + '\x04';
          } while (bVar5);
          cVar7 = cVar7 + '\x01';
        }
LAB_00146f67:
        local_368._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_368,cVar7);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_368._M_dataplus._M_p,(uint)local_368._M_string_length,uVar3);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,0x170c8c);
        pIVar15 = (IMC_Generator *)(puVar9 + 2);
        if ((IMC_Generator *)*puVar9 == pIVar15) {
          local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
          local_388._24_8_ = puVar9[3];
          local_388._0_8_ = (IMC_Generator *)(local_388 + 0x10);
        }
        else {
          local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
          local_388._0_8_ = (IMC_Generator *)*puVar9;
        }
        local_388._8_8_ = puVar9[1];
        *puVar9 = pIVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append(local_388);
        psVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_3a8.field_2._M_allocated_capacity = *psVar12;
          local_3a8.field_2._8_8_ = puVar9[3];
          local_3a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3a8.field_2._M_allocated_capacity = *psVar12;
          local_3a8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_3a8._M_string_length = puVar9[1];
        *puVar9 = psVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
          operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != paVar1) {
          operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
        }
        __x = (double)std::__cxx11::string::pop_back();
        break;
      case 3:
        uVar3 = *(uint *)((long)(p_Var4 + 2) + 8);
        cVar7 = '\x01';
        if (9 < uVar3) {
          uVar11 = uVar3;
          cVar6 = '\x04';
          do {
            cVar7 = cVar6;
            if (uVar11 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_001470ab;
            }
            if (uVar11 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_001470ab;
            }
            if (uVar11 < 10000) goto LAB_001470ab;
            bVar5 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar6 = cVar7 + '\x04';
          } while (bVar5);
          cVar7 = cVar7 + '\x01';
        }
LAB_001470ab:
        local_368._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_368,cVar7);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_368._M_dataplus._M_p,(uint)local_368._M_string_length,uVar3);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,0x170e6d);
        local_388._0_8_ = local_388 + 0x10;
        pIVar15 = (IMC_Generator *)(puVar9 + 2);
        if ((IMC_Generator *)*puVar9 == pIVar15) {
          local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
          local_388._24_8_ = puVar9[3];
        }
        else {
          local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
          local_388._0_8_ = (IMC_Generator *)*puVar9;
        }
        local_388._8_8_ = puVar9[1];
        *puVar9 = pIVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append(local_388);
        psVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_3a8.field_2._M_allocated_capacity = *psVar12;
          local_3a8.field_2._8_8_ = puVar9[3];
          local_3a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3a8.field_2._M_allocated_capacity = *psVar12;
          local_3a8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_3a8._M_string_length = puVar9[1];
        *puVar9 = psVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        __x = (double)std::__cxx11::string::_M_append
                                ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
        goto LAB_00147197;
      case 4:
        uVar3 = *(uint *)((long)(p_Var4 + 2) + 8);
        cVar7 = '\x01';
        if (9 < uVar3) {
          uVar11 = uVar3;
          cVar6 = '\x04';
          do {
            cVar7 = cVar6;
            if (uVar11 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_00146e74;
            }
            if (uVar11 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_00146e74;
            }
            if (uVar11 < 10000) goto LAB_00146e74;
            bVar5 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar6 = cVar7 + '\x04';
          } while (bVar5);
          cVar7 = cVar7 + '\x01';
        }
LAB_00146e74:
        local_368._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_368,cVar7);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_368._M_dataplus._M_p,(uint)local_368._M_string_length,uVar3);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,0x170e74);
        local_388._0_8_ = local_388 + 0x10;
        pIVar15 = (IMC_Generator *)(puVar9 + 2);
        if ((IMC_Generator *)*puVar9 == pIVar15) {
          local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
          local_388._24_8_ = puVar9[3];
        }
        else {
          local_388._16_8_ = (pIVar15->super_BuilderExecutable)._vptr_BuilderExecutable;
          local_388._0_8_ = (IMC_Generator *)*puVar9;
        }
        local_388._8_8_ = puVar9[1];
        *puVar9 = pIVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append(local_388);
        psVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_3a8.field_2._M_allocated_capacity = *psVar12;
          local_3a8.field_2._8_8_ = puVar9[3];
          local_3a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3a8.field_2._M_allocated_capacity = *psVar12;
          local_3a8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_3a8._M_string_length = puVar9[1];
        *puVar9 = psVar12;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        __x = (double)std::__cxx11::string::_M_append
                                ((char *)local_348,(ulong)local_3a8._M_dataplus._M_p);
LAB_00147197:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          __x = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
        }
        if ((IMC_Generator *)local_388._0_8_ != (IMC_Generator *)(local_388 + 0x10)) {
          operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
          __x = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != paVar1) {
          operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          __x = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
        }
      }
switchD_00146b34_default:
      helper::log((helper *)local_348,__x);
      if (local_348[0] != local_338) {
        operator_delete(local_348[0],(long)local_338[0] + 1);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      p_Var13 = p_Var13->_M_next;
    } while (p_Var13 != local_58);
  }
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"__END__","");
  helper::log((helper *)local_348,(double)CONCAT44(extraout_XMM0_Db_91,extraout_XMM0_Da_91));
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],(long)local_338[0] + 1);
  }
  if (local_308 != (IMC_Generator *)local_2f8) {
    operator_delete(local_308,local_2f8._0_8_ + 1);
  }
  return;
}

Assistant:

void IMC_Generator::printAssembly( CodeBase & base )
	{
		log( "__ASM__" );

		String tabs = "";

		for( auto c : base.imCommands )
		{//Print all commands
			String out = tabs;
			if( c->type == IM_Command::Type::operation )
			{
				if( c->operation == HexOp::nop )					out += "NOP";

				else if( c->operation == HexOp::clr_a )				out += "CLR A";
				else if( c->operation == HexOp::clr_c )				out += "CLR C";

				else if( c->operation == HexOp::mov_a_const )		out += "MOV A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_a_adr )			out += "MOV A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_a_r0 )			out += "MOV A, R0";
				else if( c->operation == HexOp::mov_a_atr0 )		out += "MOV A, @R0";
				else if( c->operation == HexOp::mov_a_atr1 )		out += "MOV A, @R1";
				else if( c->operation == HexOp::mov_adr_const )		out += "MOV " + operatorToString( c->op1 ) + ", " + operatorToString( c->op2 );
				else if( c->operation == HexOp::mov_adr_a )			out += "MOV " + operatorToString( c->op1 ) + ", A";
				else if( c->operation == HexOp::mov_adr_r0 )		out += "MOV " + operatorToString( c->op1 ) + ", R0";
				else if( c->operation == HexOp::mov_adr_atr0 )		out += "MOV " + operatorToString( c->op1 ) + ", @R0";
				else if( c->operation == HexOp::mov_adr_adr )		out += "MOV " + operatorToString( c->op1 ) + ", " + operatorToString( c->op2 ) + " ; r into l";
				else if( c->operation == HexOp::mov_r0_const )		out += "MOV R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_r0_a )			out += "MOV R0, A";
				else if( c->operation == HexOp::mov_r0_adr )		out += "MOV R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_r1_const )		out += "MOV R1, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_r1_a )			out += "MOV R1, A";
				else if( c->operation == HexOp::mov_r1_adr )		out += "MOV R1, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_atr0_const )	out += "MOV @R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_atr0_a )		out += "MOV @R0, A";
				else if( c->operation == HexOp::mov_atr1_a )		out += "MOV @R1, A";
				else if( c->operation == HexOp::mov_atr0_adr )		out += "MOV @R0, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::mov_dptr_const )	out += "MOV DPTR, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::movx_a_dptr )		out += "MOVX A, @DPTR";
				else if( c->operation == HexOp::movx_dptr_a )		out += "MOVX @DPTR, A";

				else if( c->operation == HexOp::push_adr )			out += "PUSH " + operatorToString( c->op1 );
				else if( c->operation == HexOp::pop_adr )			out += "POP " + operatorToString( c->op1 );

				else if( c->operation == HexOp::xch_a_r0 )			out += "XCH A, R0";
				else if( c->operation == HexOp::xch_r0_a )			out += "XCH R0, A";
				else if( c->operation == HexOp::xch_a_r1 )			out += "XCH A, R1";
				else if( c->operation == HexOp::xch_r1_a )			out += "XCH R1, A";
				else if( c->operation == HexOp::xch_a_atr0 )		out += "XCH A, @R0";
				else if( c->operation == HexOp::xch_atr0_a )		out += "XCH @R0, A";
				else if( c->operation == HexOp::xch_a_adr )			out += "XCH A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::xch_adr_a )			out += "XCH " + operatorToString( c->op1 ) + ", A";

				else if( c->operation == HexOp::add_a_const )		out += "ADD A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::add_a_adr )			out += "ADD A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::add_a_r0 )			out += "ADD A, R0";
				else if( c->operation == HexOp::add_a_atr0 )		out += "ADD A, @R0";
				else if( c->operation == HexOp::sub_a_const )		out += "SUBB A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::sub_a_adr )			out += "SUBB A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::sub_a_r0 )			out += "SUBB A, R0";
				else if( c->operation == HexOp::sub_a_atr0 )		out += "SUBB A, @R0";
				else if( c->operation == HexOp::mul_a_b )			out += "MUL AB";
				else if( c->operation == HexOp::div_a_b )			out += "DIV AB";

				else if( c->operation == HexOp::inc_a )				out += "INC A";
				else if( c->operation == HexOp::dec_a )				out += "DEC A";
				else if( c->operation == HexOp::rr_a )				out += "RR A";
				else if( c->operation == HexOp::rl_a )				out += "RL A";

				else if( c->operation == HexOp::and_a_const )		out += "ANL A, #" + operatorToString( c->op1 );
				else if( c->operation == HexOp::and_a_adr )			out += "ANL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::and_a_atr0 )		out += "ANL A, @R0";
				else if( c->operation == HexOp::or_a_const )		out += "ORL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::or_a_adr )			out += "ORL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::or_a_atr0 )			out += "ORL A, @R0";
				else if( c->operation == HexOp::xor_a_const )		out += "XRL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::xor_a_adr )			out += "XRL A, " + operatorToString( c->op1 );
				else if( c->operation == HexOp::xor_a_atr0 )		out += "XRL A, @R0";

				else if( c->operation == HexOp::cpl_a )				out += "CPL A";

				else if( c->operation == HexOp::cpl_bit )			out += "CPL " + operatorToString( c->op1 );
				else if( c->operation == HexOp::clr_bit )			out += "CLR " + operatorToString( c->op1 );
				else if( c->operation == HexOp::set_bit )			out += "SETB " + operatorToString( c->op1 );

				else if( c->operation == HexOp::jmp_abs )			out += "LJMP " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_rel )			out += "SJMP " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_c_rel )			out += "JC " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_nc_rel )		out += "JNC " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_z_rel )			out += "JZ " + operatorToString( c->op1 );
				else if( c->operation == HexOp::jmp_nz_rel )		out += "JNZ " + operatorToString( c->op1 );

				else if( c->operation == HexOp::call_abs )			out += "LCALL " + operatorToString( c->op1 );
				else if( c->operation == HexOp::ret )				out += "RET";
				else if( c->operation == HexOp::reti )				out += "RETI";

				else if( c->operation == HexOp::reti )				out += "-!-UNKNOWN_COMMAND-!-";
			}
			else if( c->type == IM_Command::Type::blockBegin )
			{
				if( c->symbol != "" ) out += c->symbol + ", ";
				out += "begin" + to_string( c->id ) + ":";
				tabs += '\t';
			}
			else if( c->type == IM_Command::Type::blockEnd )
			{
				out += "end" + to_string( c->id ) + ":";
				tabs.pop_back();
			}
			else if( c->type == IM_Command::Type::blockFinish )
			{
				out += "finish" + to_string( c->id ) + ":";
			}
			else if( c->type == IM_Command::Type::conditionEnd )
			{
				out += "true" + to_string( c->id ) + ":";
			}

			log( out );
		}

		log( "__END__" );
	}